

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlParser.cpp
# Opt level: O2

void __thiscall KDReports::Test::testHandler(Test *this)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  QStandardItem *pQVar4;
  QStringList expectedCallbacks;
  QString ptext;
  QArrayDataPointer<char16_t> local_2d8;
  Report report;
  QStandardItemModel model;
  QArrayDataPointer<char16_t> local_298;
  QFile file;
  TestXmlElementHandler handler;
  QArrayDataPointer<char16_t> local_240;
  QArrayDataPointer<char16_t> local_228;
  QArrayDataPointer<char16_t> local_210;
  QArrayDataPointer<char16_t> local_1f8;
  QArrayDataPointer<char16_t> local_1e0;
  QArrayDataPointer<char16_t> local_1c8;
  QArrayDataPointer<char16_t> local_1b0;
  QArrayDataPointer<char16_t> local_198;
  QArrayDataPointer<char16_t> local_180;
  QArrayDataPointer<char16_t> local_168;
  QArrayDataPointer<char16_t> local_150;
  QArrayDataPointer<char16_t> local_138;
  QArrayDataPointer<char16_t> local_120;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_c0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_60;
  QArrayDataPointer<char16_t> local_48;
  QArrayDataPointer<char16_t> local_30;
  
  QString::QString((QString *)&handler,":/handler.xml");
  QFile::QFile(&file,(QString *)&handler);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&handler);
  bVar1 = (bool)QFile::open(&file,1);
  cVar2 = QTest::qVerify(bVar1,"file.open(QIODevice::ReadOnly)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                         ,0xf1);
  if (cVar2 != '\0') {
    KDReports::Report::Report(&report,(QObject *)0x0);
    TestXmlElementHandler::TestXmlElementHandler(&handler,&report);
    KDReports::Report::setXmlElementHandler((XmlElementHandler *)&report);
    QStandardItemModel::QStandardItemModel(&model,(QObject *)0x0);
    pQVar4 = (QStandardItem *)operator_new(0x10);
    QString::QString((QString *)&expectedCallbacks,"modelCell");
    QStandardItem::QStandardItem(pQVar4,(QString *)&expectedCallbacks);
    QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    pQVar4 = (QStandardItem *)operator_new(0x10);
    QString::QString((QString *)&expectedCallbacks,"<html><b>htmlCell</b>");
    QStandardItem::QStandardItem(pQVar4,(QString *)&expectedCallbacks);
    QStandardItemModel::setItem((int)&model,0,(QStandardItem *)0x1);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    QString::QString((QString *)&expectedCallbacks,"model1");
    KDReports::Report::associateModel((QString *)&report,(QAbstractItemModel *)&expectedCallbacks);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    QString::QString((QString *)&expectedCallbacks,"testModified");
    QString::QString(&ptext,"modified");
    KDReports::Report::associateTextValue((QString *)&report,(QString *)&expectedCallbacks);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&ptext.d);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&expectedCallbacks);
    bVar1 = (bool)KDReports::Report::loadFromXML((QIODevice *)&report,(ErrorDetails *)&file);
    cVar2 = QTest::qVerify(bVar1,"report.loadFromXML(&file)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0xff);
    if (cVar2 != '\0') {
      KDReports::XmlElementHandler::errorDetails();
      bVar3 = KDReports::ErrorDetails::hasError();
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!handler.errorDetails().hasError()","",
                             "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                             ,0x100);
      KDReports::ErrorDetails::~ErrorDetails((ErrorDetails *)&expectedCallbacks);
      if (cVar2 != '\0') {
        expectedCallbacks.d.d = (Data *)0x0;
        expectedCallbacks.d.ptr = (QString *)0x0;
        expectedCallbacks.d.size = 0;
        QString::QString(&ptext,"startReport");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,&ptext);
        QString::QString((QString *)&local_2d8,"startHeader");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_2d8);
        QString::QString((QString *)&local_298,"imageElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_298);
        QString::QString((QString *)&local_30,"variable");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_30);
        QString::QString((QString *)&local_48,"endHeader");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_48);
        QString::QString((QString *)&local_60,"startFooter");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_60);
        QString::QString((QString *)&local_78,"textElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_78);
        QString::QString((QString *)&local_90,"endFooter");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_90);
        QString::QString((QString *)&local_a8,"tabs");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_a8);
        QString::QString((QString *)&local_c0,"paragraph-margins");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_c0);
        QString::QString((QString *)&local_d8,"textElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_d8);
        QString::QString((QString *)&local_f0,"textElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_f0);
        QString::QString((QString *)&local_108,"hLineElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_108);
        QString::QString((QString *)&local_120,"vspace");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_120);
        QString::QString((QString *)&local_138,"htmlElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_138);
        QString::QString((QString *)&local_150,"textElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_150);
        QString::QString((QString *)&local_168,"htmlElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_168);
        QString::QString((QString *)&local_180,"startTableElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_180);
        QString::QString((QString *)&local_198,"startCell");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_198);
        QString::QString((QString *)&local_1b0,"textElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_1b0);
        QString::QString((QString *)&local_1c8,"endCell");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_1c8);
        QString::QString((QString *)&local_1e0,"endTableElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_1e0);
        QString::QString((QString *)&local_1f8,"textElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_1f8);
        QString::QString((QString *)&local_210,"customElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_210);
        QString::QString((QString *)&local_228,"autoTableElement");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_228);
        QString::QString((QString *)&local_240,"endReport");
        QList<QString>::emplaceBack<QString>(&expectedCallbacks,(QString *)&local_240);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_240);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_228);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_210);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1c8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1b0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_198);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_168);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_138);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_120);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c0);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_60);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&ptext.d);
        ptext.d.d = (Data *)handler.cb.d.d;
        ptext.d.ptr = (char16_t *)handler.cb.d.ptr;
        ptext.d.size = handler.cb.d.size;
        if (handler.cb.d.d != (Data *)0x0) {
          LOCK();
          ((handler.cb.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((handler.cb.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
          UNLOCK();
        }
        bVar1 = QTest::qCompare<QString>
                          ((QList<QString> *)&ptext,&expectedCallbacks,"handler.callbacks()",
                           "expectedCallbacks",
                           "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                           ,0x11d);
        QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)&ptext);
        if (bVar1) {
          KDReports::Report::mainTextDocument();
          QTextDocument::toPlainText();
          QString::replace((QChar)(char16_t)&ptext,(QChar)0xfffc,0x23);
          QString::QString((QString *)&local_2d8,
                           "Title\n#\n \nTest used by XmlParser.cpp\nmodelCell\nhtmlCell\n\nTableElement example\n\nmodified\nCustom element\n\nmodelCell\nhtmlCell\n"
                          );
          bVar1 = QTest::qCompare(&ptext,(QString *)&local_2d8,"ptext",
                                  "QString(\"Title\\n#\\n \\nTest used by XmlParser.cpp\\nmodelCell\\nhtmlCell\\n\\nTableElement example\\n\\nmodified\\nCustom element\\n\\nmodelCell\\nhtmlCell\\n\")"
                                  ,
                                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                                  ,0x126);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
          if (bVar1) {
            KDReports::Report::mainTextDocument();
            QTextDocument::toPlainText();
            QTextDocument::toPlainText();
            QTest::qCompare((QString *)&local_2d8,(QString *)&local_298,
                            "report.mainTextDocument()->toPlainText()","doc.toPlainText()",
                            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/unittests/XmlParser/XmlParser.cpp"
                            ,0x127);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_298);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2d8);
          }
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&ptext.d);
        }
        QArrayDataPointer<QString>::~QArrayDataPointer(&expectedCallbacks.d);
      }
    }
    QStandardItemModel::~QStandardItemModel(&model);
    TestXmlElementHandler::~TestXmlElementHandler(&handler);
    KDReports::Report::~Report(&report);
  }
  QFile::~QFile(&file);
  return;
}

Assistant:

void testHandler()
    {
        QFile file(":/handler.xml");
        QVERIFY(file.open(QIODevice::ReadOnly));
        Report report;
        TestXmlElementHandler handler(report);
        report.setXmlElementHandler(&handler);

        QStandardItemModel model;
        model.setItem(0, 0, new QStandardItem("modelCell"));
        // HTML cells need to start with "<html>" for KDReportsAutoTable
        // (not necessary if it's just for <html model="..." row="..." column="...">)
        model.setItem(0, 1, new QStandardItem("<html><b>htmlCell</b>"));
        report.associateModel("model1", &model);

        report.associateTextValue("testModified", "modified");

        QVERIFY(report.loadFromXML(&file));
        QVERIFY(!handler.errorDetails().hasError());
        QStringList expectedCallbacks;
        expectedCallbacks << "startReport"
                          << "startHeader"
                          << "imageElement"
                          << "variable"
                          << "endHeader"
                          << "startFooter"
                          << "textElement"
                          << "endFooter"
                          << "tabs"
                          << "paragraph-margins"
                          << "textElement"
                          << "textElement"
                          << "hLineElement"
                          << "vspace"
                          << "htmlElement"
                          << "textElement"
                          << "htmlElement"
                          << "startTableElement"
                          << "startCell"
                          << "textElement"
                          << "endCell"
                          << "endTableElement"
                          << "textElement"
                          << "customElement"
                          << "autoTableElement"
                          << "endReport";
        // qDebug() << handler.callbacks();
        QCOMPARE(handler.callbacks(), expectedCallbacks);
        QTextDocument &doc = *report.mainTextDocument();

        QString ptext = doc.toPlainText();

        // custom objects (such as HLineTextObject) are represented
        // as 0xFFFC
        ptext.replace(QChar(0xFFFC), '#');

        QCOMPARE(ptext, QString("Title\n#\n \nTest used by XmlParser.cpp\nmodelCell\nhtmlCell\n\nTableElement example\n\nmodified\nCustom element\n\nmodelCell\nhtmlCell\n"));
        QCOMPARE(report.mainTextDocument()->toPlainText(), doc.toPlainText());
    }